

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O3

void __thiscall
mjs::gc_vector<mjs::object::property>::gc_table::
emplace_back<mjs::string_const&,mjs::value_const&,mjs::property_attribute&>
          (gc_table *this,string *args,value *args_1,property_attribute *args_2)

{
  uint uVar1;
  property_attribute pVar2;
  
  uVar1 = this->length_;
  if (uVar1 < this->capacity_) {
    this->length_ = uVar1 + 1;
    pVar2 = *args_2;
    *(uint32_t *)&this[(ulong)uVar1 + 1].heap_ =
         (args->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
    *(property_attribute *)((long)&this[(ulong)uVar1 + 1].heap_ + 4) = pVar2;
    value_representation::value_representation
              ((value_representation *)&this[(ulong)uVar1 + 1].capacity_,args_1);
    return;
  }
  __assert_fail("length() < capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h",
                0x82,
                "void mjs::gc_vector<mjs::object::property>::gc_table::emplace_back(Args &&...) [T = mjs::object::property, Args = <const mjs::string &, const mjs::value &, mjs::property_attribute &>]"
               );
}

Assistant:

uint32_t length() const { return length_; }